

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O0

vorbis_info_mapping * mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int *i_00;
  long lVar4;
  int testA;
  int testM;
  codec_setup_info *ci;
  vorbis_info_mapping0 *info;
  int b;
  int i;
  oggpack_buffer *opb_local;
  vorbis_info *vi_local;
  
  i_00 = (int *)calloc(1,0xc88);
  pvVar1 = vi->codec_setup;
  if (0 < vi->channels) {
    lVar4 = oggpack_read(opb,1);
    if (-1 < (int)lVar4) {
      if ((int)lVar4 == 0) {
        *i_00 = 1;
      }
      else {
        lVar4 = oggpack_read(opb,4);
        *i_00 = (int)lVar4 + 1;
        if (*i_00 < 1) goto LAB_002d137b;
      }
      lVar4 = oggpack_read(opb,1);
      if (-1 < (int)lVar4) {
        if ((int)lVar4 != 0) {
          lVar4 = oggpack_read(opb,8);
          i_00[0x121] = (int)lVar4 + 1;
          if (i_00[0x121] < 1) goto LAB_002d137b;
          for (info._4_4_ = 0; info._4_4_ < i_00[0x121]; info._4_4_ = info._4_4_ + 1) {
            iVar2 = ov_ilog(vi->channels - 1);
            lVar4 = oggpack_read(opb,iVar2);
            iVar2 = (int)lVar4;
            i_00[(long)info._4_4_ + 0x122] = iVar2;
            iVar3 = ov_ilog(vi->channels - 1);
            lVar4 = oggpack_read(opb,iVar3);
            iVar3 = (int)lVar4;
            i_00[(long)info._4_4_ + 0x222] = iVar3;
            if ((((iVar2 < 0) || (iVar3 < 0)) || (iVar2 == iVar3)) ||
               ((vi->channels <= iVar2 || (vi->channels <= iVar3)))) goto LAB_002d137b;
          }
        }
        lVar4 = oggpack_read(opb,2);
        if (lVar4 == 0) {
          if (1 < *i_00) {
            for (info._4_4_ = 0; info._4_4_ < vi->channels; info._4_4_ = info._4_4_ + 1) {
              lVar4 = oggpack_read(opb,4);
              i_00[(long)info._4_4_ + 1] = (int)lVar4;
              if ((*i_00 <= i_00[(long)info._4_4_ + 1]) || (i_00[(long)info._4_4_ + 1] < 0))
              goto LAB_002d137b;
            }
          }
          info._4_4_ = 0;
          while( true ) {
            if (*i_00 <= info._4_4_) {
              return i_00;
            }
            oggpack_read(opb,8);
            lVar4 = oggpack_read(opb,8);
            i_00[(long)info._4_4_ + 0x101] = (int)lVar4;
            if ((*(int *)((long)pvVar1 + 0x18) <= i_00[(long)info._4_4_ + 0x101]) ||
               (i_00[(long)info._4_4_ + 0x101] < 0)) break;
            lVar4 = oggpack_read(opb,8);
            i_00[(long)info._4_4_ + 0x111] = (int)lVar4;
            if ((*(int *)((long)pvVar1 + 0x1c) <= i_00[(long)info._4_4_ + 0x111]) ||
               (i_00[(long)info._4_4_ + 0x111] < 0)) break;
            info._4_4_ = info._4_4_ + 1;
          }
        }
      }
    }
  }
LAB_002d137b:
  mapping0_free_info(i_00);
  return (vorbis_info_mapping *)0x0;
}

Assistant:

static vorbis_info_mapping *mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int i,b;
  vorbis_info_mapping0 *info=_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=vi->codec_setup;
  if(vi->channels<=0)goto err_out;

  b=oggpack_read(opb,1);
  if(b<0)goto err_out;
  if(b){
    info->submaps=oggpack_read(opb,4)+1;
    if(info->submaps<=0)goto err_out;
  }else
    info->submaps=1;

  b=oggpack_read(opb,1);
  if(b<0)goto err_out;
  if(b){
    info->coupling_steps=oggpack_read(opb,8)+1;
    if(info->coupling_steps<=0)goto err_out;
    for(i=0;i<info->coupling_steps;i++){
      /* vi->channels > 0 is enforced in the caller */
      int testM=info->coupling_mag[i]=
        oggpack_read(opb,ov_ilog(vi->channels-1));
      int testA=info->coupling_ang[i]=
        oggpack_read(opb,ov_ilog(vi->channels-1));

      if(testM<0 ||
         testA<0 ||
         testM==testA ||
         testM>=vi->channels ||
         testA>=vi->channels) goto err_out;
    }

  }

  if(oggpack_read(opb,2)!=0)goto err_out; /* 2,3:reserved */

  if(info->submaps>1){
    for(i=0;i<vi->channels;i++){
      info->chmuxlist[i]=oggpack_read(opb,4);
      if(info->chmuxlist[i]>=info->submaps || info->chmuxlist[i]<0)goto err_out;
    }
  }
  for(i=0;i<info->submaps;i++){
    oggpack_read(opb,8); /* time submap unused */
    info->floorsubmap[i]=oggpack_read(opb,8);
    if(info->floorsubmap[i]>=ci->floors || info->floorsubmap[i]<0)goto err_out;
    info->residuesubmap[i]=oggpack_read(opb,8);
    if(info->residuesubmap[i]>=ci->residues || info->residuesubmap[i]<0)goto err_out;
  }

  return info;

 err_out:
  mapping0_free_info(info);
  return(NULL);
}